

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioDriver.cpp
# Opt level: O0

void __thiscall AudioDriver::loadAudioSettings(AudioDriver *this)

{
  qsizetype qVar1;
  byte bVar2;
  uint uVar3;
  SamplerateConversionQuality SVar4;
  Master *this_00;
  QVariant local_250;
  QString local_230;
  QVariant local_218;
  QVariant local_1f8;
  QString local_1d8;
  QVariant local_1c0;
  QVariant local_1a0;
  QString local_180;
  QVariant local_168;
  QVariant local_148;
  QString local_128;
  QVariant local_110;
  QVariant local_f0;
  QString local_d0;
  QVariant local_b8;
  QVariant local_98;
  QString local_68;
  QVariant local_50;
  undefined1 local_30 [8];
  QString prefix;
  QSettings *qSettings;
  AudioDriver *this_local;
  
  this_00 = Master::getInstance();
  prefix.d.size = (qsizetype)Master::getSettings(this_00);
  ::operator+((QString *)local_30,"Audio/",&this->id);
  qVar1 = prefix.d.size;
  ::operator+(&local_68,(QString *)local_30,"/SampleRate");
  QVariant::QVariant(&local_98,0);
  QSettings::value((QString *)&local_50,(QVariant *)qVar1);
  uVar3 = QVariant::toUInt((bool *)&local_50);
  (this->settings).sampleRate = uVar3;
  QVariant::~QVariant(&local_50);
  QVariant::~QVariant(&local_98);
  QString::~QString(&local_68);
  qVar1 = prefix.d.size;
  ::operator+(&local_d0,(QString *)local_30,"/SRCQuality");
  QVariant::QVariant(&local_f0,2);
  QSettings::value((QString *)&local_b8,(QVariant *)qVar1);
  SVar4 = QVariant::toUInt((bool *)&local_b8);
  (this->settings).srcQuality = SVar4;
  QVariant::~QVariant(&local_b8);
  QVariant::~QVariant(&local_f0);
  QString::~QString(&local_d0);
  qVar1 = prefix.d.size;
  ::operator+(&local_128,(QString *)local_30,"/ChunkLen");
  QVariant::QVariant(&local_148);
  QSettings::value((QString *)&local_110,(QVariant *)qVar1);
  uVar3 = QVariant::toInt((bool *)&local_110);
  (this->settings).chunkLen = uVar3;
  QVariant::~QVariant(&local_110);
  QVariant::~QVariant(&local_148);
  QString::~QString(&local_128);
  qVar1 = prefix.d.size;
  ::operator+(&local_180,(QString *)local_30,"/AudioLatency");
  QVariant::QVariant(&local_1a0);
  QSettings::value((QString *)&local_168,(QVariant *)qVar1);
  uVar3 = QVariant::toInt((bool *)&local_168);
  (this->settings).audioLatency = uVar3;
  QVariant::~QVariant(&local_168);
  QVariant::~QVariant(&local_1a0);
  QString::~QString(&local_180);
  qVar1 = prefix.d.size;
  ::operator+(&local_1d8,(QString *)local_30,"/MidiLatency");
  QVariant::QVariant(&local_1f8);
  QSettings::value((QString *)&local_1c0,(QVariant *)qVar1);
  uVar3 = QVariant::toInt((bool *)&local_1c0);
  (this->settings).midiLatency = uVar3;
  QVariant::~QVariant(&local_1c0);
  QVariant::~QVariant(&local_1f8);
  QString::~QString(&local_1d8);
  qVar1 = prefix.d.size;
  ::operator+(&local_230,(QString *)local_30,"/AdvancedTiming");
  QVariant::QVariant(&local_250,true);
  QSettings::value((QString *)&local_218,(QVariant *)qVar1);
  bVar2 = QVariant::toBool();
  (this->settings).advancedTiming = (bool)(bVar2 & 1);
  QVariant::~QVariant(&local_218);
  QVariant::~QVariant(&local_250);
  QString::~QString(&local_230);
  (*this->_vptr_AudioDriver[1])(this,&this->settings);
  QString::~QString((QString *)local_30);
  return;
}

Assistant:

void AudioDriver::loadAudioSettings() {
	QSettings *qSettings = Master::getInstance()->getSettings();
	QString prefix = "Audio/" + id;
	settings.sampleRate = qSettings->value(prefix + "/SampleRate", 0).toUInt();
	settings.srcQuality = MT32Emu::SamplerateConversionQuality(qSettings->value(prefix + "/SRCQuality", MT32Emu::SamplerateConversionQuality_GOOD).toUInt());
	settings.chunkLen = qSettings->value(prefix + "/ChunkLen").toInt();
	settings.audioLatency = qSettings->value(prefix + "/AudioLatency").toInt();
	settings.midiLatency = qSettings->value(prefix + "/MidiLatency").toInt();
	settings.advancedTiming = qSettings->value(prefix + "/AdvancedTiming", true).toBool();
	validateAudioSettings(settings);
}